

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

spv_result_t __thiscall
spvtools::val::ValidationState_t::RegisterFunction
          (ValidationState_t *this,uint32_t id,uint32_t ret_type_id,
          FunctionControlMask function_control,uint32_t function_type_id)

{
  uint32_t local_30;
  FunctionControlMask local_2c;
  uint32_t local_28;
  uint32_t local_24;
  Function *local_20;
  
  local_30 = function_type_id;
  local_2c = function_control;
  local_28 = ret_type_id;
  local_24 = id;
  if (this->in_function_ != true) {
    this->in_function_ = true;
    std::vector<spvtools::val::Function,std::allocator<spvtools::val::Function>>::
    emplace_back<unsigned_int&,unsigned_int&,spv::FunctionControlMask&,unsigned_int&>
              ((vector<spvtools::val::Function,std::allocator<spvtools::val::Function>> *)
               &this->module_functions_,&local_24,&local_28,&local_2c,&local_30);
    local_20 = current_function(this);
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::val::Function*>,std::allocator<std::pair<unsigned_int_const,spvtools::val::Function*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<unsigned_int&,spvtools::val::Function*>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::val::Function*>,std::allocator<std::pair<unsigned_int_const,spvtools::val::Function*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->id_to_function_,&local_24);
    return SPV_SUCCESS;
  }
  __assert_fail("in_function_body() == false && \"RegisterFunction can only be called when parsing the binary outside \" \"of another function\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validation_state.cpp"
                ,0x1f9,
                "spv_result_t spvtools::val::ValidationState_t::RegisterFunction(uint32_t, uint32_t, spv::FunctionControlMask, uint32_t)"
               );
}

Assistant:

spv_result_t ValidationState_t::RegisterFunction(
    uint32_t id, uint32_t ret_type_id,
    spv::FunctionControlMask function_control, uint32_t function_type_id) {
  assert(in_function_body() == false &&
         "RegisterFunction can only be called when parsing the binary outside "
         "of another function");
  in_function_ = true;
  module_functions_.emplace_back(id, ret_type_id, function_control,
                                 function_type_id);
  id_to_function_.emplace(id, &current_function());

  // TODO(umar): validate function type and type_id

  return SPV_SUCCESS;
}